

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O3

QPDF_ERROR_CODE trap_errors(qpdf_data qpdf,function<void_(_qpdf_data_*)> *fn)

{
  QPDF_BOOL QVar1;
  qpdf_data local_28;
  
  local_28 = qpdf;
  if ((fn->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*fn->_M_invoker)((_Any_data *)fn,&local_28);
    QVar1 = qpdf_more_warnings(qpdf);
    return QVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

static QPDF_ERROR_CODE
trap_errors(qpdf_data qpdf, std::function<void(qpdf_data)> fn)
{
    QPDF_ERROR_CODE status = QPDF_SUCCESS;
    try {
        fn(qpdf);
    } catch (QPDFExc& e) {
        qpdf->error = std::make_shared<QPDFExc>(e);
        status |= QPDF_ERRORS;
    } catch (std::runtime_error& e) {
        qpdf->error = std::make_shared<QPDFExc>(qpdf_e_system, "", "", 0, e.what());
        status |= QPDF_ERRORS;
    } catch (std::exception& e) {
        qpdf->error = std::make_shared<QPDFExc>(qpdf_e_internal, "", "", 0, e.what());
        status |= QPDF_ERRORS;
    }

    if (qpdf_more_warnings(qpdf)) {
        status |= QPDF_WARNINGS;
    }
    return status;
}